

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O3

void CreateBackwardReferencesNH42
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command_conflict *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  uint16_t *puVar4;
  BrotliDictionary *pBVar5;
  undefined8 uVar6;
  int iVar7;
  bool bVar8;
  size_t sVar9;
  uint uVar10;
  uint32_t uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  int *piVar17;
  ulong uVar18;
  byte bVar19;
  size_t sVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ushort uVar25;
  int iVar26;
  ulong uVar27;
  ushort uVar28;
  size_t sVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  uint8_t *puVar34;
  bool bVar35;
  uint uVar36;
  long lVar37;
  int *piVar38;
  int iVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  uint uVar44;
  int last_distance;
  HasherCommon *self;
  ulong local_160;
  size_t local_158;
  ulong local_150;
  ulong local_148;
  ulong local_138;
  ulong local_128;
  int *local_118;
  ulong local_100;
  ulong local_f0;
  ulong local_e0;
  Command_conflict *local_d0;
  ulong local_a8;
  
  iVar12 = params->lgwin;
  uVar3 = (position - 3) + num_bytes;
  sVar20 = position;
  if (3 < num_bytes) {
    sVar20 = uVar3;
  }
  lVar21 = 0x200;
  if (params->quality < 9) {
    lVar21 = 0x40;
  }
  local_158 = *last_insert_len;
  iVar26 = (int)*(undefined8 *)dist_cache;
  iVar39 = (int)((ulong)*(undefined8 *)dist_cache >> 0x20);
  dist_cache[4] = iVar26 + -1;
  dist_cache[5] = iVar26 + 1;
  dist_cache[6] = iVar26 + -2;
  dist_cache[7] = iVar26 + 2;
  dist_cache[8] = iVar26 + -3;
  dist_cache[9] = iVar26 + 3;
  dist_cache[10] = iVar39 + -1;
  dist_cache[0xb] = iVar39 + 1;
  dist_cache[0xc] = iVar39 + -2;
  dist_cache[0xd] = iVar39 + 2;
  dist_cache[0xe] = iVar39 + -3;
  dist_cache[0xf] = iVar39 + 3;
  uVar1 = position + num_bytes;
  if (uVar1 <= position + 4) {
    local_d0 = commands;
LAB_00116bc8:
    *last_insert_len = (local_158 + uVar1) - position;
    *num_commands = *num_commands + ((long)local_d0 - (long)commands >> 4);
    return;
  }
  uVar40 = (1L << ((byte)iVar12 & 0x3f)) - 0x10;
  local_a8 = lVar21 + position;
  lVar2 = position - 1;
  local_d0 = commands;
  sVar29 = position;
LAB_00115795:
  local_e0 = uVar1 - sVar29;
  uVar15 = uVar40;
  if (sVar29 < uVar40) {
    uVar15 = sVar29;
  }
  uVar16 = (params->dist).max_distance;
  uVar30 = sVar29 & ringbuffer_mask;
  piVar17 = (int *)(ringbuffer + uVar30);
  uVar44 = (uint)(*(int *)(ringbuffer + uVar30) * 0x1e35a7bd) >> 0x11;
  uVar18 = (ulong)((uint)local_e0 & 7);
  uVar13 = local_e0 & 0xfffffffffffffff8;
  local_f0 = 0x7e4;
  uVar33 = 0;
  lVar14 = 0;
  local_150 = 0;
  local_148 = 0;
  do {
    uVar27 = (ulong)dist_cache[lVar14];
    uVar22 = sVar29 - uVar27;
    if ((((lVar14 == 0) || (hasher[(uVar22 & 0xffff) + 0x30028] == (uint8_t)uVar44)) &&
        (uVar27 <= uVar15)) && (uVar22 < sVar29)) {
      if (7 < local_e0) {
        lVar37 = 0;
        uVar31 = 0;
LAB_00115866:
        if (*(ulong *)(piVar17 + uVar31 * 2) ==
            *(ulong *)(ringbuffer + uVar31 * 8 + (uVar22 & ringbuffer_mask))) goto code_r0x00115873;
        uVar31 = *(ulong *)(ringbuffer + uVar31 * 8 + (uVar22 & ringbuffer_mask)) ^
                 *(ulong *)(piVar17 + uVar31 * 2);
        uVar22 = 0;
        if (uVar31 != 0) {
          for (; (uVar31 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
          }
        }
        uVar31 = (uVar22 >> 3 & 0x1fffffff) - lVar37;
        goto LAB_001158b7;
      }
      uVar32 = 0;
      piVar38 = piVar17;
LAB_00115925:
      uVar31 = uVar32;
      if (uVar18 != 0) {
        uVar41 = uVar18 | uVar32;
        uVar42 = uVar18;
        do {
          uVar31 = uVar32;
          if (ringbuffer[uVar32 + (uVar22 & ringbuffer_mask)] != (uint8_t)*piVar38) break;
          piVar38 = (int *)((long)piVar38 + 1);
          uVar32 = uVar32 + 1;
          uVar42 = uVar42 - 1;
          uVar31 = uVar41;
        } while (uVar42 != 0);
      }
LAB_001158b7:
      if ((1 < uVar31) && (uVar22 = uVar31 * 0x87 + 0x78f, local_f0 < uVar22)) {
        if (lVar14 != 0) {
          uVar22 = uVar22 - ((0x1ca10U >> ((byte)lVar14 & 0xe) & 0xe) + 0x27);
        }
        if (local_f0 < uVar22) {
          uVar33 = uVar31;
          local_150 = uVar31;
          local_148 = uVar27;
          local_f0 = uVar22;
        }
      }
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x10);
  uVar22 = (ulong)uVar44;
  uVar36 = uVar44 & 0x1ff;
  lVar14 = *(long *)(hasher + 0x140428);
  uVar27 = sVar29 - *(uint *)(hasher + uVar22 * 4 + 0x28);
  uVar28 = *(ushort *)(hasher + uVar22 * 2 + 0x20028);
  if (lVar14 != 0) {
    uVar32 = 0;
    uVar31 = uVar27;
    lVar37 = lVar14;
    uVar25 = uVar28;
    do {
      uVar32 = uVar31 + uVar32;
      if (uVar15 < uVar32) break;
      if (uVar30 + uVar33 <= ringbuffer_mask) {
        uVar31 = sVar29 - uVar32 & ringbuffer_mask;
        if ((uVar31 + uVar33 <= ringbuffer_mask) &&
           (ringbuffer[uVar30 + uVar33] == ringbuffer[uVar31 + uVar33])) {
          if (7 < local_e0) {
            lVar23 = 0;
            uVar42 = 0;
LAB_00115a0c:
            if (*(ulong *)(piVar17 + uVar42 * 2) == *(ulong *)(ringbuffer + uVar42 * 8 + uVar31))
            goto code_r0x00115a19;
            uVar42 = *(ulong *)(ringbuffer + uVar42 * 8 + uVar31) ^ *(ulong *)(piVar17 + uVar42 * 2)
            ;
            uVar31 = 0;
            if (uVar42 != 0) {
              for (; (uVar42 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
              }
            }
            uVar42 = (uVar31 >> 3 & 0x1fffffff) - lVar23;
            goto LAB_00115a57;
          }
          uVar41 = 0;
          local_118 = piVar17;
LAB_00115ab6:
          uVar42 = uVar41;
          if (uVar18 != 0) {
            uVar43 = uVar18 | uVar41;
            uVar24 = uVar18;
            do {
              uVar42 = uVar41;
              if (ringbuffer[uVar41 + uVar31] != (uint8_t)*local_118) break;
              local_118 = (int *)((long)local_118 + 1);
              uVar41 = uVar41 + 1;
              uVar24 = uVar24 - 1;
              uVar42 = uVar43;
            } while (uVar24 != 0);
          }
LAB_00115a57:
          if (3 < uVar42) {
            iVar12 = 0x1f;
            if ((uint)uVar32 != 0) {
              for (; (uint)uVar32 >> iVar12 == 0; iVar12 = iVar12 + -1) {
              }
            }
            uVar31 = (ulong)(iVar12 * -0x1e + 0x780) + uVar42 * 0x87;
            if (local_f0 < uVar31) {
              uVar33 = uVar42;
              local_150 = uVar42;
              local_148 = uVar32;
              local_f0 = uVar31;
            }
          }
        }
      }
      uVar31 = (ulong)uVar25;
      uVar25 = *(ushort *)(hasher + uVar31 * 4 + (ulong)(uVar36 << 0xb) + 0x4002a);
      uVar31 = (ulong)*(ushort *)(hasher + uVar31 * 4 + (ulong)(uVar36 << 0xb) + 0x40028);
      lVar37 = lVar37 + -1;
    } while (lVar37 != 0);
  }
  uVar25 = *(ushort *)(hasher + (ulong)uVar36 * 2 + 0x140028);
  *(ushort *)(hasher + (ulong)uVar36 * 2 + 0x140028) = uVar25 + 1;
  uVar10 = uVar25 & 0x1ff;
  hasher[(sVar29 & 0xffff) + 0x30028] = (uint8_t)uVar44;
  if (0xfffe < uVar27) {
    uVar27 = 0xffff;
  }
  *(short *)(hasher + (ulong)uVar10 * 4 + (ulong)(uVar36 << 0xb) + 0x40028) = (short)uVar27;
  *(ushort *)(hasher + (ulong)uVar10 * 4 + (ulong)(uVar36 << 0xb) + 0x4002a) = uVar28;
  *(int *)(hasher + uVar22 * 4 + 0x28) = (int)sVar29;
  *(short *)(hasher + uVar22 * 2 + 0x20028) = (short)uVar10;
  if (local_f0 == 0x7e4) {
    uVar33 = *(ulong *)(hasher + 0x18);
    local_138 = *(ulong *)(hasher + 0x20);
    if (uVar33 >> 7 <= local_138) {
      uVar13 = (ulong)((uint)(*piVar17 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      puVar4 = (params->dictionary).hash_table;
      local_f0 = 0x7e4;
      iVar12 = 0;
      bVar35 = true;
LAB_00115bd4:
      uVar28 = puVar4[uVar13];
      uVar33 = uVar33 + 1;
      *(ulong *)(hasher + 0x18) = uVar33;
      if ((ulong)uVar28 != 0) {
        uVar44 = uVar28 & 0x1f;
        uVar30 = (ulong)uVar44;
        if (local_e0 < uVar30) goto LAB_00115d25;
        pBVar5 = (params->dictionary).words;
        puVar34 = pBVar5->data + (ulong)pBVar5->offsets_by_length[uVar30] + uVar30 * (uVar28 >> 5);
        if (7 < uVar30) {
          uVar18 = (ulong)(uVar28 & 0x18);
          lVar37 = 0;
          uVar22 = 0;
LAB_00115c5e:
          if (*(ulong *)(puVar34 + uVar22 * 8) == *(ulong *)(piVar17 + uVar22 * 2))
          goto code_r0x00115c70;
          uVar22 = *(ulong *)(piVar17 + uVar22 * 2) ^ *(ulong *)(puVar34 + uVar22 * 8);
          uVar18 = 0;
          if (uVar22 != 0) {
            for (; (uVar22 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
            }
          }
          uVar22 = (uVar18 >> 3 & 0x1fffffff) - lVar37;
          goto LAB_00115cb4;
        }
        uVar18 = 0;
        goto LAB_00115dac;
      }
      goto LAB_00115d25;
    }
  }
  else {
    iVar12 = 0;
LAB_00115e15:
    if (0x7e4 < local_f0) {
      uVar15 = local_158 + 4;
      uVar16 = (lVar2 + num_bytes) - sVar29;
      iVar26 = 0;
      local_100 = local_148;
LAB_00115e4b:
      local_e0 = local_e0 - 1;
      uVar33 = local_150 - 1;
      if (local_e0 <= local_150 - 1) {
        uVar33 = local_e0;
      }
      if (4 < params->quality) {
        uVar33 = 0;
      }
      uVar13 = sVar29 + 1;
      local_148 = uVar40;
      if (uVar13 < uVar40) {
        local_148 = uVar13;
      }
      uVar30 = (params->dist).max_distance;
      uVar22 = uVar13 & ringbuffer_mask;
      piVar17 = (int *)(ringbuffer + uVar22);
      uVar44 = (uint)(*(int *)(ringbuffer + uVar22) * 0x1e35a7bd) >> 0x11;
      uVar27 = (ulong)((uint)local_e0 & 7);
      uVar18 = 0x7e4;
      lVar37 = 0;
      local_128 = 0;
      local_160 = 0;
LAB_00115ef4:
      uVar32 = (ulong)dist_cache[lVar37];
      uVar31 = uVar13 - uVar32;
      if (((lVar37 == 0) || (hasher[(uVar31 & 0xffff) + 0x30028] == (uint8_t)uVar44)) &&
         ((uVar32 <= local_148 && (uVar31 < uVar13)))) {
        uVar42 = uVar27;
        if (7 < local_e0) {
          lVar23 = 0;
          uVar41 = 0;
LAB_00115f3e:
          if (*(ulong *)(piVar17 + uVar41 * 2) ==
              *(ulong *)(ringbuffer + uVar41 * 8 + (uVar31 & ringbuffer_mask)))
          goto code_r0x00115f50;
          uVar42 = *(ulong *)(ringbuffer + uVar41 * 8 + (uVar31 & ringbuffer_mask)) ^
                   *(ulong *)(piVar17 + uVar41 * 2);
          uVar31 = 0;
          if (uVar42 != 0) {
            for (; (uVar42 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
            }
          }
          uVar41 = (uVar31 >> 3 & 0x1fffffff) - lVar23;
          goto LAB_00115f86;
        }
        uVar41 = 0;
        piVar38 = piVar17;
        goto joined_r0x00115ff9;
      }
      goto LAB_00115fda;
    }
  }
  local_158 = local_158 + 1;
  position = sVar29 + 1;
  if (local_a8 < position) {
    if ((uint)((int)lVar21 * 4) + local_a8 < position) {
      uVar15 = sVar29 + 0x11;
      if (uVar1 - 4 <= sVar29 + 0x11) {
        uVar15 = uVar1 - 4;
      }
      for (; position < uVar15; position = position + 4) {
        uVar44 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
        uVar16 = (ulong)uVar44;
        uVar10 = uVar44 & 0x1ff;
        uVar28 = *(ushort *)(hasher + (ulong)uVar10 * 2 + 0x140028);
        *(ushort *)(hasher + (ulong)uVar10 * 2 + 0x140028) = uVar28 + 1;
        uVar36 = uVar28 & 0x1ff;
        uVar33 = position - *(uint *)(hasher + uVar16 * 4 + 0x28);
        if (0xfffe < uVar33) {
          uVar33 = 0xffff;
        }
        hasher[(position & 0xffff) + 0x30028] = (uint8_t)uVar44;
        *(short *)(hasher + (ulong)uVar36 * 4 + (ulong)(uVar10 << 0xb) + 0x40028) = (short)uVar33;
        *(undefined2 *)(hasher + (ulong)uVar36 * 4 + (ulong)(uVar10 << 0xb) + 0x4002a) =
             *(undefined2 *)(hasher + uVar16 * 2 + 0x20028);
        *(int *)(hasher + uVar16 * 4 + 0x28) = (int)position;
        *(short *)(hasher + uVar16 * 2 + 0x20028) = (short)uVar36;
        local_158 = local_158 + 4;
      }
    }
    else {
      uVar15 = sVar29 + 9;
      if (uVar3 <= sVar29 + 9) {
        uVar15 = uVar3;
      }
      for (; position < uVar15; position = position + 2) {
        uVar44 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
        uVar16 = (ulong)uVar44;
        uVar10 = uVar44 & 0x1ff;
        uVar28 = *(ushort *)(hasher + (ulong)uVar10 * 2 + 0x140028);
        *(ushort *)(hasher + (ulong)uVar10 * 2 + 0x140028) = uVar28 + 1;
        uVar36 = uVar28 & 0x1ff;
        uVar33 = position - *(uint *)(hasher + uVar16 * 4 + 0x28);
        if (0xfffe < uVar33) {
          uVar33 = 0xffff;
        }
        hasher[(position & 0xffff) + 0x30028] = (uint8_t)uVar44;
        *(short *)(hasher + (ulong)uVar36 * 4 + (ulong)(uVar10 << 0xb) + 0x40028) = (short)uVar33;
        *(undefined2 *)(hasher + (ulong)uVar36 * 4 + (ulong)(uVar10 << 0xb) + 0x4002a) =
             *(undefined2 *)(hasher + uVar16 * 2 + 0x20028);
        *(int *)(hasher + uVar16 * 4 + 0x28) = (int)position;
        *(short *)(hasher + uVar16 * 2 + 0x20028) = (short)uVar36;
        local_158 = local_158 + 2;
      }
    }
  }
  goto LAB_00116b64;
code_r0x00115873:
  uVar31 = uVar31 + 1;
  lVar37 = lVar37 + -8;
  uVar32 = uVar13;
  piVar38 = (int *)(uVar13 + (long)piVar17);
  if (local_e0 >> 3 == uVar31) goto LAB_00115925;
  goto LAB_00115866;
code_r0x00115a19:
  uVar42 = uVar42 + 1;
  lVar23 = lVar23 + -8;
  uVar41 = uVar13;
  local_118 = (int *)(uVar13 + (long)piVar17);
  if (local_e0 >> 3 == uVar42) goto LAB_00115ab6;
  goto LAB_00115a0c;
code_r0x00115c70:
  uVar22 = uVar22 + 1;
  lVar37 = lVar37 + -8;
  if (uVar44 >> 3 == uVar22) goto code_r0x00115c7c;
  goto LAB_00115c5e;
code_r0x00115c7c:
  puVar34 = puVar34 + -lVar37;
LAB_00115dac:
  uVar27 = (ulong)uVar28 & 7;
  uVar22 = uVar18;
  if ((uVar28 & 7) != 0) {
    uVar31 = uVar18 | uVar27;
    do {
      uVar22 = uVar18;
      if (*(uint8_t *)((long)piVar17 + uVar18) != *puVar34) break;
      puVar34 = puVar34 + 1;
      uVar18 = uVar18 + 1;
      uVar27 = uVar27 - 1;
      uVar22 = uVar31;
    } while (uVar27 != 0);
  }
LAB_00115cb4:
  if (((uVar22 != 0) && (uVar30 < (params->dictionary).cutoffTransformsCount + uVar22)) &&
     (uVar30 = (ulong)(uVar28 >> 5) + uVar15 + 1 +
               ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                              ((char)(uVar30 - uVar22) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar30 - uVar22) * 4 << (pBVar5->size_bits_by_length[uVar30] & 0x3f)),
     uVar30 <= uVar16)) {
    iVar26 = 0x1f;
    if ((uint)uVar30 != 0) {
      for (; (uint)uVar30 >> iVar26 == 0; iVar26 = iVar26 + -1) {
      }
    }
    uVar18 = (uVar22 * 0x87 - (ulong)(uint)(iVar26 * 0x1e)) + 0x780;
    if (local_f0 <= uVar18) {
      iVar12 = uVar44 - (int)uVar22;
      local_138 = local_138 + 1;
      *(ulong *)(hasher + 0x20) = local_138;
      local_148 = uVar30;
      local_150 = uVar22;
      local_f0 = uVar18;
    }
  }
LAB_00115d25:
  uVar13 = uVar13 + 1;
  bVar8 = !bVar35;
  bVar35 = false;
  if (bVar8) goto LAB_00115e15;
  goto LAB_00115bd4;
code_r0x00115f50:
  uVar41 = uVar41 + 1;
  lVar23 = lVar23 + -8;
  if (uVar16 >> 3 == uVar41) goto code_r0x00115f5e;
  goto LAB_00115f3e;
code_r0x00115f5e:
  uVar41 = -lVar23;
  piVar38 = (int *)((long)piVar17 - lVar23);
joined_r0x00115ff9:
  for (; (uVar42 != 0 && (ringbuffer[uVar41 + (uVar31 & ringbuffer_mask)] == (uint8_t)*piVar38));
      uVar41 = uVar41 + 1) {
    uVar42 = uVar42 - 1;
    piVar38 = (int *)((long)piVar38 + 1);
  }
LAB_00115f86:
  if ((1 < uVar41) && (uVar31 = uVar41 * 0x87 + 0x78f, uVar18 < uVar31)) {
    if (lVar37 != 0) {
      uVar31 = uVar31 - ((0x1ca10U >> ((byte)lVar37 & 0xe) & 0xe) + 0x27);
    }
    if (uVar18 < uVar31) {
      uVar18 = uVar31;
      uVar33 = uVar41;
      local_160 = uVar32;
      local_128 = uVar41;
    }
  }
LAB_00115fda:
  lVar37 = lVar37 + 1;
  if (lVar37 == 0x10) goto LAB_00116029;
  goto LAB_00115ef4;
LAB_00116029:
  uVar31 = (ulong)uVar44;
  uVar36 = uVar44 & 0x1ff;
  uVar32 = uVar13 - *(uint *)(hasher + uVar31 * 4 + 0x28);
  uVar28 = *(ushort *)(hasher + uVar31 * 2 + 0x20028);
  if (lVar14 != 0) {
    uVar41 = 0;
    uVar42 = uVar32;
    lVar37 = lVar14;
    uVar25 = uVar28;
LAB_0011607b:
    uVar41 = uVar42 + uVar41;
    if (uVar41 <= local_148) {
      if (uVar22 + uVar33 <= ringbuffer_mask) {
        uVar42 = uVar13 - uVar41 & ringbuffer_mask;
        if ((ringbuffer_mask < uVar42 + uVar33) ||
           (ringbuffer[uVar22 + uVar33] != ringbuffer[uVar42 + uVar33])) goto LAB_00116190;
        uVar24 = uVar27;
        if (7 < local_e0) {
          lVar23 = 0;
          uVar43 = 0;
LAB_001160e8:
          if (*(ulong *)(piVar17 + uVar43 * 2) == *(ulong *)(ringbuffer + uVar43 * 8 + uVar42))
          goto code_r0x001160fa;
          uVar24 = *(ulong *)(ringbuffer + uVar43 * 8 + uVar42) ^ *(ulong *)(piVar17 + uVar43 * 2);
          uVar42 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
            }
          }
          uVar43 = (uVar42 >> 3 & 0x1fffffff) - lVar23;
          goto LAB_0011614c;
        }
        uVar43 = 0;
        piVar38 = piVar17;
        goto joined_r0x001161cd;
      }
      goto LAB_00116190;
    }
  }
LAB_00116207:
  uVar25 = *(ushort *)(hasher + (ulong)uVar36 * 2 + 0x140028);
  *(ushort *)(hasher + (ulong)uVar36 * 2 + 0x140028) = uVar25 + 1;
  uVar10 = uVar25 & 0x1ff;
  hasher[(uVar13 & 0xffff) + 0x30028] = (uint8_t)uVar44;
  if (0xfffe < uVar32) {
    uVar32 = 0xffff;
  }
  *(short *)(hasher + (ulong)uVar10 * 4 + (ulong)(uVar36 << 0xb) + 0x40028) = (short)uVar32;
  *(ushort *)(hasher + (ulong)uVar10 * 4 + (ulong)(uVar36 << 0xb) + 0x4002a) = uVar28;
  *(int *)(hasher + uVar31 * 4 + 0x28) = (int)uVar13;
  *(short *)(hasher + uVar31 * 2 + 0x20028) = (short)uVar10;
  if (uVar18 == 0x7e4) {
    uVar33 = *(ulong *)(hasher + 0x18);
    local_118 = *(int **)(hasher + 0x20);
    uVar18 = 0x7e4;
    if (uVar33 >> 7 <= local_118) {
      uVar22 = (ulong)((uint)(*piVar17 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      puVar4 = (params->dictionary).hash_table;
      iVar39 = 0;
      uVar18 = 0x7e4;
      bVar35 = true;
LAB_00116364:
      uVar28 = puVar4[uVar22];
      uVar33 = uVar33 + 1;
      *(ulong *)(hasher + 0x18) = uVar33;
      if ((ulong)uVar28 != 0) {
        uVar44 = uVar28 & 0x1f;
        uVar27 = (ulong)uVar44;
        if (local_e0 < uVar27) goto LAB_0011638d;
        pBVar5 = (params->dictionary).words;
        puVar34 = pBVar5->data + (ulong)pBVar5->offsets_by_length[uVar27] + uVar27 * (uVar28 >> 5);
        if (7 < uVar27) {
          uVar32 = (ulong)(uVar28 & 0x18);
          lVar37 = 0;
          uVar31 = 0;
LAB_001163f6:
          if (*(ulong *)(puVar34 + uVar31 * 8) == *(ulong *)(piVar17 + uVar31 * 2))
          goto code_r0x00116408;
          uVar32 = *(ulong *)(piVar17 + uVar31 * 2) ^ *(ulong *)(puVar34 + uVar31 * 8);
          uVar31 = 0;
          if (uVar32 != 0) {
            for (; (uVar32 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
            }
          }
          uVar31 = (uVar31 >> 3 & 0x1fffffff) - lVar37;
          goto LAB_0011644e;
        }
        uVar32 = 0;
        goto LAB_0011651f;
      }
      goto LAB_0011638d;
    }
    iVar39 = 0;
  }
  else {
    iVar39 = 0;
  }
LAB_001162bd:
  if (uVar18 < local_f0 + 0xaf) {
    uVar13 = sVar29;
    local_128 = local_150;
    iVar39 = iVar12;
    sVar9 = local_158;
    local_148 = uVar40;
    if (sVar29 < uVar40) {
      local_148 = sVar29;
    }
    goto LAB_00116795;
  }
  local_100 = local_160;
  sVar9 = uVar15;
  if (iVar26 == 3) goto LAB_00116795;
  local_158 = local_158 + 1;
  iVar26 = iVar26 + 1;
  uVar33 = sVar29 + 5;
  uVar16 = uVar16 - 1;
  local_150 = local_128;
  sVar29 = uVar13;
  local_f0 = uVar18;
  sVar9 = local_158;
  iVar12 = iVar39;
  if (uVar1 <= uVar33) goto LAB_00116795;
  goto LAB_00115e4b;
code_r0x001160fa:
  uVar43 = uVar43 + 1;
  lVar23 = lVar23 + -8;
  if (uVar16 >> 3 == uVar43) goto code_r0x00116108;
  goto LAB_001160e8;
code_r0x00116108:
  uVar43 = -lVar23;
  piVar38 = (int *)((long)piVar17 - lVar23);
joined_r0x001161cd:
  for (; (uVar24 != 0 && (ringbuffer[uVar43 + uVar42] == (uint8_t)*piVar38)); uVar43 = uVar43 + 1) {
    uVar24 = uVar24 - 1;
    piVar38 = (int *)((long)piVar38 + 1);
  }
LAB_0011614c:
  if (3 < uVar43) {
    iVar39 = 0x1f;
    if ((uint)uVar41 != 0) {
      for (; (uint)uVar41 >> iVar39 == 0; iVar39 = iVar39 + -1) {
      }
    }
    uVar42 = (ulong)(iVar39 * -0x1e + 0x780) + uVar43 * 0x87;
    if (uVar18 < uVar42) {
      uVar18 = uVar42;
      uVar33 = uVar43;
      local_160 = uVar41;
      local_128 = uVar43;
    }
  }
LAB_00116190:
  uVar42 = (ulong)uVar25;
  uVar25 = *(ushort *)(hasher + uVar42 * 4 + (ulong)(uVar36 << 0xb) + 0x4002a);
  uVar42 = (ulong)*(ushort *)(hasher + uVar42 * 4 + (ulong)(uVar36 << 0xb) + 0x40028);
  lVar37 = lVar37 + -1;
  if (lVar37 == 0) goto LAB_00116207;
  goto LAB_0011607b;
code_r0x00116408:
  uVar31 = uVar31 + 1;
  lVar37 = lVar37 + -8;
  if (uVar44 >> 3 == uVar31) goto code_r0x00116414;
  goto LAB_001163f6;
code_r0x00116414:
  puVar34 = puVar34 + -lVar37;
LAB_0011651f:
  uVar42 = (ulong)uVar28 & 7;
  uVar31 = uVar32;
  if ((uVar28 & 7) != 0) {
    uVar41 = uVar32 | uVar42;
    do {
      uVar31 = uVar32;
      if (*(uint8_t *)((long)piVar17 + uVar32) != *puVar34) break;
      puVar34 = puVar34 + 1;
      uVar32 = uVar32 + 1;
      uVar42 = uVar42 - 1;
      uVar31 = uVar41;
    } while (uVar42 != 0);
  }
LAB_0011644e:
  if (((uVar31 != 0) && (uVar27 < (params->dictionary).cutoffTransformsCount + uVar31)) &&
     (uVar27 = (ulong)(uVar28 >> 5) + local_148 + 1 +
               ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                              ((char)(uVar27 - uVar31) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar27 - uVar31) * 4 << (pBVar5->size_bits_by_length[uVar27] & 0x3f)),
     uVar27 <= uVar30)) {
    iVar7 = 0x1f;
    if ((uint)uVar27 != 0) {
      for (; (uint)uVar27 >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    uVar32 = (uVar31 * 0x87 - (ulong)(uint)(iVar7 * 0x1e)) + 0x780;
    if (uVar18 <= uVar32) {
      iVar39 = uVar44 - (int)uVar31;
      local_118 = (int *)((long)local_118 + 1);
      *(int **)(hasher + 0x20) = local_118;
      uVar18 = uVar32;
      local_128 = uVar31;
      local_160 = uVar27;
    }
  }
LAB_0011638d:
  uVar22 = uVar22 + 1;
  bVar8 = !bVar35;
  bVar35 = false;
  if (bVar8) goto LAB_001162bd;
  goto LAB_00116364;
LAB_00116795:
  local_158 = sVar9;
  if (local_148 < local_100) {
LAB_0011679f:
    uVar15 = local_100 + 0xf;
  }
  else {
    if (local_100 == (long)*dist_cache) {
      uVar15 = 0;
      goto LAB_00116827;
    }
    uVar15 = 1;
    if (local_100 != (long)dist_cache[1]) {
      uVar15 = (local_100 + 3) - (long)*dist_cache;
      if (uVar15 < 7) {
        bVar19 = (byte)((int)uVar15 << 2);
        uVar44 = 0x9750468;
      }
      else {
        uVar15 = (local_100 + 3) - (long)dist_cache[1];
        if (6 < uVar15) {
          uVar15 = 2;
          if ((local_100 != (long)dist_cache[2]) && (uVar15 = 3, local_100 != (long)dist_cache[3]))
          goto LAB_0011679f;
          goto LAB_001167a3;
        }
        bVar19 = (byte)((int)uVar15 << 2);
        uVar44 = 0xfdb1ace;
      }
      uVar15 = (ulong)(uVar44 >> (bVar19 & 0x1f) & 0xf);
    }
  }
LAB_001167a3:
  if ((local_100 <= local_148) && (uVar15 != 0)) {
    dist_cache[3] = dist_cache[2];
    uVar6 = *(undefined8 *)dist_cache;
    *(undefined8 *)(dist_cache + 1) = uVar6;
    iVar12 = (int)local_100;
    *dist_cache = iVar12;
    dist_cache[4] = iVar12 + -1;
    dist_cache[5] = iVar12 + 1;
    dist_cache[6] = iVar12 + -2;
    dist_cache[7] = iVar12 + 2;
    dist_cache[8] = iVar12 + -3;
    dist_cache[9] = iVar12 + 3;
    iVar12 = (int)uVar6;
    dist_cache[10] = iVar12 + -1;
    dist_cache[0xb] = iVar12 + 1;
    dist_cache[0xc] = iVar12 + -2;
    dist_cache[0xd] = iVar12 + 2;
    *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar12 + 3,iVar12 + -3);
  }
LAB_00116827:
  local_d0->insert_len_ = (uint32_t)local_158;
  local_d0->copy_len_ = iVar39 << 0x19 | (uint)local_128;
  uVar33 = (ulong)(params->dist).num_direct_distance_codes;
  uVar16 = uVar33 + 0x10;
  uVar11 = 0;
  if (uVar16 <= uVar15) {
    uVar44 = (params->dist).distance_postfix_bits;
    bVar19 = (byte)uVar44;
    uVar33 = ((4L << (bVar19 & 0x3f)) + (uVar15 - uVar33)) - 0x10;
    uVar36 = 0x1f;
    uVar10 = (uint)uVar33;
    if (uVar10 != 0) {
      for (; uVar10 >> uVar36 == 0; uVar36 = uVar36 - 1) {
      }
    }
    uVar36 = (uVar36 ^ 0xffffffe0) + 0x1f;
    uVar30 = (ulong)((uVar33 >> ((ulong)uVar36 & 0x3f) & 1) != 0);
    lVar14 = (ulong)uVar36 - (ulong)uVar44;
    uVar15 = (~(-1 << (bVar19 & 0x1f)) & uVar10) + uVar16 +
             (uVar30 + lVar14 * 2 + 0xfffe << (bVar19 & 0x3f)) | lVar14 * 0x400;
    uVar11 = (uint32_t)(uVar33 - (uVar30 + 2 << ((byte)uVar36 & 0x3f)) >> (bVar19 & 0x3f));
  }
  local_d0->dist_prefix_ = (uint16_t)uVar15;
  local_d0->dist_extra_ = uVar11;
  uVar16 = local_158;
  if (5 < local_158) {
    if (local_158 < 0x82) {
      uVar44 = 0x1f;
      uVar36 = (uint)(local_158 - 2);
      if (uVar36 != 0) {
        for (; uVar36 >> uVar44 == 0; uVar44 = uVar44 - 1) {
        }
      }
      uVar16 = (ulong)((int)(local_158 - 2 >> ((char)(uVar44 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                       (uVar44 ^ 0xffffffe0) * 2 + 0x40);
    }
    else if (local_158 < 0x842) {
      uVar36 = (uint32_t)local_158 - 0x42;
      uVar44 = 0x1f;
      if (uVar36 != 0) {
        for (; uVar36 >> uVar44 == 0; uVar44 = uVar44 - 1) {
        }
      }
      uVar16 = (ulong)((uVar44 ^ 0xffe0) + 0x2a);
    }
    else {
      uVar16 = 0x15;
      if (0x1841 < local_158) {
        uVar16 = (ulong)(ushort)(0x17 - (local_158 < 0x5842));
      }
    }
  }
  uVar44 = iVar39 + (uint)local_128;
  if (uVar44 < 10) {
    uVar36 = uVar44 - 2;
  }
  else if (uVar44 < 0x86) {
    uVar44 = uVar44 - 6;
    uVar36 = 0x1f;
    if (uVar44 != 0) {
      for (; uVar44 >> uVar36 == 0; uVar36 = uVar36 - 1) {
      }
    }
    uVar36 = (uVar44 >> ((char)(uVar36 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar36 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar36 = 0x17;
    if (uVar44 < 0x846) {
      uVar36 = 0x1f;
      if (uVar44 - 0x46 != 0) {
        for (; uVar44 - 0x46 >> uVar36 == 0; uVar36 = uVar36 - 1) {
        }
      }
      uVar36 = (uVar36 ^ 0xffe0) + 0x2c;
    }
  }
  uVar25 = (ushort)uVar36;
  uVar28 = (uVar25 & 7) + ((ushort)uVar16 & 7) * 8;
  if ((((uVar15 & 0x3ff) == 0) && ((ushort)uVar16 < 8)) && (uVar25 < 0x10)) {
    if (7 < uVar25) {
      uVar28 = uVar28 | 0x40;
    }
  }
  else {
    iVar12 = (int)((uVar16 & 0xffff) >> 3) * 3 + ((uVar36 & 0xffff) >> 3);
    uVar28 = uVar28 + ((ushort)(0x520d40 >> ((char)iVar12 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar12 * 0x40 + 0x40;
  }
  local_d0->cmd_prefix_ = uVar28;
  *num_literals = *num_literals + local_158;
  position = local_128 + uVar13;
  uVar15 = sVar20;
  if (position < sVar20) {
    uVar15 = position;
  }
  uVar16 = uVar13 + 2;
  if (local_100 < local_128 >> 2) {
    uVar33 = position + local_100 * -4;
    if (uVar33 < uVar16) {
      uVar33 = uVar16;
    }
    uVar16 = uVar33;
    if (uVar15 < uVar33) {
      uVar16 = uVar15;
    }
  }
  local_a8 = uVar13 + lVar21 + local_128 * 2;
  local_d0 = local_d0 + 1;
  if (uVar16 < uVar15) {
    do {
      uVar44 = (uint)(*(int *)(ringbuffer + (uVar16 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
      uVar33 = (ulong)uVar44;
      uVar10 = uVar44 & 0x1ff;
      uVar28 = *(ushort *)(hasher + (ulong)uVar10 * 2 + 0x140028);
      *(ushort *)(hasher + (ulong)uVar10 * 2 + 0x140028) = uVar28 + 1;
      uVar36 = uVar28 & 0x1ff;
      uVar13 = uVar16 - *(uint *)(hasher + uVar33 * 4 + 0x28);
      hasher[(uVar16 & 0xffff) + 0x30028] = (uint8_t)uVar44;
      if (0xfffe < uVar13) {
        uVar13 = 0xffff;
      }
      *(short *)(hasher + (ulong)uVar36 * 4 + (ulong)(uVar10 << 0xb) + 0x40028) = (short)uVar13;
      *(undefined2 *)(hasher + (ulong)uVar36 * 4 + (ulong)(uVar10 << 0xb) + 0x4002a) =
           *(undefined2 *)(hasher + uVar33 * 2 + 0x20028);
      *(int *)(hasher + uVar33 * 4 + 0x28) = (int)uVar16;
      *(short *)(hasher + uVar33 * 2 + 0x20028) = (short)uVar36;
      uVar16 = uVar16 + 1;
    } while (uVar15 != uVar16);
    local_158 = 0;
  }
  else {
    local_158 = 0;
  }
LAB_00116b64:
  sVar29 = position;
  if (uVar1 <= position + 4) goto LAB_00116bc8;
  goto LAB_00115795;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, HasherHandle hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(hasher, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(hasher, &params->dictionary,
                         ringbuffer, ringbuffer_mask, dist_cache, position,
                         max_length, max_distance, gap,
                         params->dist.max_distance, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        FN(FindLongestMatch)(hasher, &params->dictionary,
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, gap, params->dist.max_distance, &sr2);
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance + gap, dist_cache);
        if ((sr.distance <= (max_distance + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(hasher, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}